

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O0

long mk_cust(long n_cust,customer_t *c)

{
  int iVar1;
  long *in_RSI;
  char *in_RDI;
  long i;
  long in_stack_ffffffffffffffe8;
  
  *in_RSI = (long)in_RDI;
  sprintf((char *)(in_RSI + 1),"%s%09ld","Customer#",in_RDI);
  iVar1 = a_rnd(n_cust._4_4_,(int)n_cust,c._4_4_,(char *)i);
  *(int *)((long)in_RSI + 0x44) = iVar1;
  dss_random((long *)i,(long)in_RDI,(long)in_RSI,in_stack_ffffffffffffffe8);
  strcpy((char *)(in_RSI + 0xb),nations.list[in_stack_ffffffffffffffe8].text);
  strcpy((char *)((long)in_RSI + 0x6c),
         regions.list[nations.list[in_stack_ffffffffffffffe8].weight].text);
  gen_city((char *)i,in_RDI);
  iVar1 = (int)((ulong)in_RDI >> 0x20);
  gen_phone(n_cust,(char *)c,i);
  pick_str((distribution *)i,iVar1,(char *)in_RSI);
  return 0;
}

Assistant:

long mk_cust(long n_cust, customer_t *c)
{
        long i;
        c->custkey = n_cust;
	sprintf(c->name, C_NAME_FMT, C_NAME_TAG, n_cust);
	c->alen = V_STR(C_ADDR_LEN, C_ADDR_SD, c->address);
    RANDOM(i, 0, nations.count-1, C_NTRG_SD);
	strcpy(c->nation_name,nations.list[i].text);
	strcpy(c->region_name,regions.list[nations.list[i].weight].text);
	gen_city(c->city,c->nation_name);
	gen_phone(i, c->phone, (long)C_PHNE_SD);
        pick_str(&c_mseg_set, C_MSEG_SD, c->mktsegment);
	return (0);
 }